

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiNavLayer nav_layer;
  ImGuiContext *pIVar1;
  ImRect local_44;
  ImRect local_34;
  char local_21;
  ImGuiContext *pIStack_20;
  bool init_for_nav;
  ImGuiContext *g;
  ImGuiWindow *pIStack_10;
  bool force_reinit_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  pIStack_20 = GImGui;
  g._7_1_ = force_reinit;
  pIStack_10 = window;
  if (window == GImGui->NavWindow) {
    if ((window->Flags & 0x40000U) == 0) {
      local_21 = '\0';
      if ((((window == window->RootWindow) || ((window->Flags & 0x4000000U) != 0)) ||
          (window->NavLastIds[0] == 0)) || (force_reinit)) {
        local_21 = '\x01';
      }
      if (local_21 == '\0') {
        GImGui->NavId = window->NavLastIds[0];
        pIVar1->NavFocusScopeId = 0;
      }
      else {
        nav_layer = GImGui->NavLayer;
        ImRect::ImRect(&local_34);
        SetNavID(0,nav_layer,0,&local_34);
        pIStack_20->NavInitRequest = true;
        pIStack_20->NavInitRequestFromMove = false;
        pIStack_20->NavInitResultId = 0;
        ImRect::ImRect(&local_44);
        (pIStack_20->NavInitResultRectRel).Min = local_44.Min;
        (pIStack_20->NavInitResultRectRel).Max = local_44.Max;
        NavUpdateAnyRequestFlag();
      }
    }
    else {
      GImGui->NavFocusScopeId = 0;
      pIVar1->NavId = 0;
    }
    return;
  }
  __assert_fail("window == g.NavWindow",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x266b,"void ImGui::NavInitWindow(ImGuiWindow *, bool)");
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    // FIXME: ChildWindow test here is wrong for docking
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = g.NavFocusScopeId = 0;
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, 0, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = 0;
    }
}